

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall ON_SubD::IsManifold(ON_SubD *this,bool *bIsOriented,bool *bHasBoundary)

{
  ON_SubDLevel *this_00;
  int local_28;
  bool local_21;
  int solid_orientation;
  bool bIsManifold;
  bool *bHasBoundary_local;
  bool *bIsOriented_local;
  ON_SubD *this_local;
  
  local_21 = false;
  *bIsOriented = false;
  *bHasBoundary = false;
  local_28 = 0;
  _solid_orientation = bHasBoundary;
  bHasBoundary_local = bIsOriented;
  bIsOriented_local = (bool *)this;
  this_00 = ActiveLevel(this);
  ON_SubDLevel::GetTopologicalAttributes
            (this_00,&local_21,bHasBoundary_local,_solid_orientation,&local_28);
  return (bool)(local_21 & 1);
}

Assistant:

bool ON_SubD::IsManifold( bool& bIsOriented, bool& bHasBoundary ) const
{
  bool bIsManifold = false;
  bIsOriented = false;
  bHasBoundary = false;
  int solid_orientation = 0;
  ActiveLevel().GetTopologicalAttributes(bIsManifold, bIsOriented, bHasBoundary, solid_orientation);
  return bIsManifold;
}